

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O3

void __thiscall
QSystemSemaphore::setNativeKey
          (QSystemSemaphore *this,QNativeIpcKey *key,int initialValue,AccessMode mode)

{
  _Head_base<0UL,_QSystemSemaphorePrivate_*,_false> _Var1;
  int *piVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QAnyStringView a;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = ::comparesEqual(key,&((this->d)._M_t.
                                super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                                .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>.
                               _M_head_impl)->nativeKey);
  if ((mode != Open) || (!bVar3)) {
    bVar3 = isKeyTypeSupported((key->typeAndFlags).type);
    _Var1._M_head_impl =
         (this->d)._M_t.
         super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
         .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
    if (bVar3) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      (_Var1._M_head_impl)->error = NoError;
      QString::operator=(&(_Var1._M_head_impl)->errorString,&local_58);
      if ((QSystemSemaphorePrivate *)local_58.d.d != (QSystemSemaphorePrivate *)0x0) {
        LOCK();
        (((Type *)&((QNativeIpcKey *)&(local_58.d.d)->super_QArrayData)->d)->
        super___atomic_base<int>)._M_i =
             (((Type *)&((QNativeIpcKey *)&(local_58.d.d)->super_QArrayData)->d)->
             super___atomic_base<int>)._M_i + -1;
        UNLOCK();
        if ((((Type *)&((QNativeIpcKey *)&(local_58.d.d)->super_QArrayData)->d)->
            super___atomic_base<int>)._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      QSystemSemaphorePrivate::cleanHandle
                ((this->d)._M_t.
                 super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                 .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl);
      _Var1._M_head_impl =
           (this->d)._M_t.
           super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
           .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
      if ((key->typeAndFlags).type ==
          ((TypeAndFlags *)((long)&(_Var1._M_head_impl)->nativeKey + 0x20))->type) {
        QNativeIpcKey::operator=(&(_Var1._M_head_impl)->nativeKey,key);
      }
      else {
        QSystemSemaphorePrivate::
        visit<QSystemSemaphorePrivate::destructBackend()::_lambda(auto:1)_1_>
                  (_Var1._M_head_impl,(anon_class_1_0_00000001 *)&local_58);
        QNativeIpcKey::operator=
                  (&((this->d)._M_t.
                     super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                     .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl)->
                    nativeKey,key);
        _Var1._M_head_impl =
             (this->d)._M_t.
             super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
             .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
        if (((TypeAndFlags *)((long)&(_Var1._M_head_impl)->nativeKey + 0x20))->type == PosixRealtime
           ) {
          *(undefined8 *)&((_Var1._M_head_impl)->backend).d = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 8) = 0;
        }
        else {
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 0x10) = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 0x18) = 0;
          *(undefined8 *)&((_Var1._M_head_impl)->backend).d = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 8) = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 0x20) = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 0x18) = 0xffffffffffffffff;
        }
      }
      local_58.d.d = (Data *)(this->d)._M_t.
                             super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                             .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
      ((QSystemSemaphorePrivate *)local_58.d.d)->initialValue = initialValue;
      local_58.d.ptr = (char16_t *)&local_70;
      local_70.d.d._0_4_ = mode;
      QtIpcCommon::
      IpcStorageVariant<&QSystemSemaphorePrivate::Backend::posix,&QSystemSemaphorePrivate::Backend::sysv,&QSystemSemaphorePrivate::Backend::win32>
      ::
      visit_internal<QSystemSemaphorePrivate::handle(QSystemSemaphore::AccessMode)::_lambda(auto:1)_1_>
                (&(((QSystemSemaphorePrivate *)local_58.d.d)->backend).d,
                 ((TypeAndFlags *)
                 ((long)&((QSystemSemaphorePrivate *)local_58.d.d)->nativeKey + 0x20))->type,
                 (anon_class_16_2_3fe3235e *)&local_58);
    }
    else {
      QCoreApplication::translate
                (&local_70,"QSystemSemaphore","%1: unsupported key type",(char *)0x0,-1);
      a.m_size = 0x400000000000001e;
      a.field_0.m_data_utf8 = "QSystemSemaphore::setNativeKey";
      QString::arg_impl(&local_58,&local_70,a,0,(QChar)0x20);
      (_Var1._M_head_impl)->error = KeyError;
      QString::operator=(&(_Var1._M_head_impl)->errorString,&local_58);
      if ((QSystemSemaphorePrivate *)local_58.d.d != (QSystemSemaphorePrivate *)0x0) {
        LOCK();
        *(int *)&((QNativeIpcKey *)&(local_58.d.d)->super_QArrayData)->d =
             *(int *)&((QNativeIpcKey *)&(local_58.d.d)->super_QArrayData)->d + -1;
        UNLOCK();
        if (*(int *)&((QNativeIpcKey *)&(local_58.d.d)->super_QArrayData)->d == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar2 = (int *)CONCAT44(local_70.d.d._4_4_,(AccessMode)local_70.d.d);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_70.d.d._4_4_,(AccessMode)local_70.d.d),2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemSemaphore::setNativeKey(const QNativeIpcKey &key, int initialValue, AccessMode mode)
{
    if (key == d->nativeKey && mode == Open)
        return;
    if (!isKeyTypeSupported(key.type())) {
        d->setError(KeyError, tr("%1: unsupported key type")
                    .arg("QSystemSemaphore::setNativeKey"_L1));
        return;
    }

    d->clearError();
    d->cleanHandle();
    if (key.type() == d->nativeKey.type()) {
        // we can reuse the backend
        d->nativeKey = key;
    } else {
        // we must recreate the backend
        d->destructBackend();
        d->nativeKey = key;
        d->constructBackend();
    }
    d->initialValue = initialValue;
    d->handle(mode);
}